

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O3

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::log
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,double __x)

{
  formatter *pfVar1;
  size_t __n;
  long in_RSI;
  undefined1 *__ptr;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar3;
  memory_buf_t formatted;
  undefined **local_138;
  undefined1 *local_130;
  size_t local_128;
  undefined8 local_120;
  undefined1 local_118 [256];
  
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  local_128 = 0;
  local_138 = &PTR_grow_001c52b0;
  local_120 = 0xfa;
  pfVar1 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_130 = local_118;
  (*pfVar1->_vptr_formatter[2])(pfVar1,in_RSI,&local_138);
  __n = local_128;
  __ptr = local_130;
  if ((this->should_do_colors_ == true) && (*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RSI + 0x30)))
  {
    fwrite(local_130,1,*(ulong *)(in_RSI + 0x28),(FILE *)this->target_file_);
    fwrite((this->colors_)._M_elems[*(int *)(in_RSI + 0x10)]._M_dataplus._M_p,1,
           (this->colors_)._M_elems[*(int *)(in_RSI + 0x10)]._M_string_length,
           (FILE *)this->target_file_);
    fwrite(local_130 + *(long *)(in_RSI + 0x28),1,
           *(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28),(FILE *)this->target_file_);
    fwrite((this->reset).data_,1,(this->reset).size_,(FILE *)this->target_file_);
    __n = local_128 - *(long *)(in_RSI + 0x30);
    __ptr = local_130 + *(long *)(in_RSI + 0x30);
  }
  fwrite(__ptr,1,__n,(FILE *)this->target_file_);
  fflush((FILE *)this->target_file_);
  uVar2 = extraout_XMM0_Da;
  uVar3 = extraout_XMM0_Db;
  if (local_130 != local_118) {
    operator_delete(local_130);
    uVar2 = extraout_XMM0_Da_00;
    uVar3 = extraout_XMM0_Db_00;
  }
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg)
{
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
    {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_[static_cast<size_t>(msg.level)]);
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    }
    else // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}